

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

void __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::reentrant_consume_operation::cancel(reentrant_consume_operation *this)

{
  ulong uVar1;
  
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar1 < 0x10) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0xa0c);
    uVar1 = *(ulong *)(this + 0x10);
  }
  LOCK();
  **(long **)(this + 8) = uVar1 - 2;
  UNLOCK();
  *(undefined8 *)(this + 0x10) = 0;
  return;
}

Assistant:

void cancel() noexcept
            {
                DENSITY_ASSERT(!empty());
                m_consume_data.cancel_consume_impl();
            }